

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

Vec_Wrd_t * Zyx_TestCreateTruthTables(int nVars,int nNodes)

{
  Vec_Wrd_t *p;
  word *pOut;
  int iVar1;
  int iVar2;
  int iVar;
  
  iVar = 0;
  iVar1 = nVars + -6;
  if (nVars < 7) {
    iVar1 = iVar;
  }
  p = Vec_WrdStart(nVars + 1 + nNodes << ((byte)iVar1 & 0x1f));
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  for (; iVar2 != iVar; iVar = iVar + 1) {
    pOut = Vec_WrdEntryP(p,iVar << ((byte)iVar1 & 0x1f));
    Abc_TtIthVar(pOut,iVar,nVars);
  }
  return p;
}

Assistant:

Vec_Wrd_t * Zyx_TestCreateTruthTables( int nVars, int nNodes )
{
    int i, nWords = Abc_TtWordNum(nVars);
    Vec_Wrd_t * vInfo = Vec_WrdStart( nWords * (nVars + nNodes + 1) ); 
    for ( i = 0; i < nVars; i++ )
        Abc_TtIthVar( Zyx_TestTruth(vInfo, i, nWords), i, nVars );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}